

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

void __thiscall VertexAttrib64Bit::VAOTest::initVAO(VAOTest *this)

{
  GLenum GVar1;
  VAOTest *this_local;
  
  (*(this->super_Base).gl.genVertexArrays)(1,&this->m_vao_id);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glGenVertexArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe62);
  (*(this->super_Base).gl.bindVertexArray)(this->m_vao_id);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glBindVertexArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe65);
  (*(this->super_Base).gl.bindBuffer)(0x8892,this->m_bo_id_1);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe69);
  (*(this->super_Base).gl.vertexAttribLPointer)
            (this->m_po_bo1_dmat3_attr_location,3,0x140a,this->m_po_bo1_dmat3_attr_stride,
             (void *)(ulong)this->m_po_bo1_dmat3_attr_offset);
  (*(this->super_Base).gl.vertexAttribLPointer)
            (this->m_po_bo1_dmat3_attr_location + 1,3,0x140a,this->m_po_bo1_dmat3_attr_stride,
             (void *)((ulong)this->m_po_bo1_dmat3_attr_offset + 0x18));
  (*(this->super_Base).gl.vertexAttribLPointer)
            (this->m_po_bo1_dmat3_attr_location + 2,3,0x140a,this->m_po_bo1_dmat3_attr_stride,
             (void *)((ulong)this->m_po_bo1_dmat3_attr_offset + 0x30));
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glVertexAttribLPointer() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe74);
  (*(this->super_Base).gl.enableVertexAttribArray)(this->m_po_bo1_dmat3_attr_location);
  (*(this->super_Base).gl.enableVertexAttribArray)(this->m_po_bo1_dmat3_attr_location + 1);
  (*(this->super_Base).gl.enableVertexAttribArray)(this->m_po_bo1_dmat3_attr_location + 2);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glEnableVertexAttribArray() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe79);
  (*(this->super_Base).gl.vertexAttribLPointer)
            (this->m_po_bo1_dvec2_attr_location,2,0x140a,this->m_po_bo1_dvec2_attr_stride,
             (void *)(ulong)this->m_po_bo1_dvec2_attr_offset);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glVertexAttribLPointer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe7e);
  (*(this->super_Base).gl.enableVertexAttribArray)(this->m_po_bo1_dvec2_attr_location);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glEnableVertexAttribArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe81);
  (*(this->super_Base).gl.vertexAttribLPointer)
            (this->m_po_bo1_double_attr_location,1,0x140a,this->m_po_bo1_double_attr_stride,
             (void *)(ulong)this->m_po_bo1_double_attr_offset);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glVertexAttribLPointer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe86);
  (*(this->super_Base).gl.enableVertexAttribArray)(this->m_po_bo1_double_attr_location);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glEnableVertexAttribArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe89);
  (*(this->super_Base).gl.vertexAttribPointer)
            (this->m_po_bo1_float2_attr_location,1,0x1402,'\0',this->m_po_bo1_float2_attr_stride,
             (void *)(ulong)this->m_po_bo1_float2_attr_offset);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glVertexAttribPointer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe8e);
  (*(this->super_Base).gl.enableVertexAttribArray)(this->m_po_bo1_float2_attr_location);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glEnableVertexAttribArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe91);
  (*(this->super_Base).gl.vertexAttribIPointer)
            (this->m_po_bo1_int_attr_location,1,0x1400,this->m_po_bo1_int_attr_stride,
             (void *)(ulong)this->m_po_bo1_int_attr_offset);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glVertexAttribIPointer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe95);
  (*(this->super_Base).gl.enableVertexAttribArray)(this->m_po_bo1_int_attr_location);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glEnableVertexAttribArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe98);
  (*(this->super_Base).gl.bindBuffer)(0x8892,this->m_bo_id_2);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe9c);
  (*(this->super_Base).gl.vertexAttribPointer)
            (this->m_po_bo2_float_attr_location,1,0x1401,'\x01',this->m_po_bo2_float_attr_stride,
             (void *)(ulong)this->m_po_bo2_float_attr_offset);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glVertexAttribPointer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xea1);
  (*(this->super_Base).gl.enableVertexAttribArray)(this->m_po_bo2_float_attr_location);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glEnableVertexAttribArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xea4);
  (*(this->super_Base).gl.vertexAttribLPointer)
            (this->m_po_bo2_dmat4x2_attr_location,2,0x140a,this->m_po_bo2_dmat4x2_attr_stride,
             (void *)(ulong)this->m_po_bo2_dmat4x2_attr_offset);
  (*(this->super_Base).gl.vertexAttribLPointer)
            (this->m_po_bo2_dmat4x2_attr_location + 1,2,0x140a,this->m_po_bo2_dmat4x2_attr_stride,
             (void *)((ulong)this->m_po_bo2_dmat4x2_attr_offset + 0x10));
  (*(this->super_Base).gl.vertexAttribLPointer)
            (this->m_po_bo2_dmat4x2_attr_location + 2,2,0x140a,this->m_po_bo2_dmat4x2_attr_stride,
             (void *)((ulong)this->m_po_bo2_dmat4x2_attr_offset + 0x20));
  (*(this->super_Base).gl.vertexAttribLPointer)
            (this->m_po_bo2_dmat4x2_attr_location + 3,2,0x140a,this->m_po_bo2_dmat4x2_attr_stride,
             (void *)((ulong)this->m_po_bo2_dmat4x2_attr_offset + 0x30));
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glVertexAttribLPointer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xeb2);
  (*(this->super_Base).gl.enableVertexAttribArray)(this->m_po_bo2_dmat4x2_attr_location);
  (*(this->super_Base).gl.enableVertexAttribArray)(this->m_po_bo2_dmat4x2_attr_location + 1);
  (*(this->super_Base).gl.enableVertexAttribArray)(this->m_po_bo2_dmat4x2_attr_location + 2);
  (*(this->super_Base).gl.enableVertexAttribArray)(this->m_po_bo2_dmat4x2_attr_location + 3);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glEnableVertexAttribArray() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xeb8);
  (*(this->super_Base).gl.bindBuffer)(0x8893,this->m_bo_id_indices);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xebc);
  return;
}

Assistant:

void VAOTest::initVAO()
{
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Set up BO1-sourced attributes */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.vertexAttribLPointer(m_po_bo1_dmat3_attr_location + 0, 3, /* size */
							GL_DOUBLE, m_po_bo1_dmat3_attr_stride,
							(const glw::GLvoid*)(deUintptr)m_po_bo1_dmat3_attr_offset);
	gl.vertexAttribLPointer(m_po_bo1_dmat3_attr_location + 1, 3, /* size */
							GL_DOUBLE, m_po_bo1_dmat3_attr_stride,
							(const glw::GLvoid*)(m_po_bo1_dmat3_attr_offset + 1 * sizeof(double) * 3));
	gl.vertexAttribLPointer(m_po_bo1_dmat3_attr_location + 2, 3, /* size */
							GL_DOUBLE, m_po_bo1_dmat3_attr_stride,
							(const glw::GLvoid*)(m_po_bo1_dmat3_attr_offset + 2 * sizeof(double) * 3));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribLPointer() call(s) failed.");

	gl.enableVertexAttribArray(m_po_bo1_dmat3_attr_location + 0);
	gl.enableVertexAttribArray(m_po_bo1_dmat3_attr_location + 1);
	gl.enableVertexAttribArray(m_po_bo1_dmat3_attr_location + 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray() call(s) failed.");

	gl.vertexAttribLPointer(m_po_bo1_dvec2_attr_location, 2, /* size */
							GL_DOUBLE, m_po_bo1_dvec2_attr_stride,
							(const glw::GLvoid*)(deUintptr)m_po_bo1_dvec2_attr_offset);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribLPointer() call failed.");

	gl.enableVertexAttribArray(m_po_bo1_dvec2_attr_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray() call failed.");

	gl.vertexAttribLPointer(m_po_bo1_double_attr_location, 1, /* size */
							GL_DOUBLE, m_po_bo1_double_attr_stride,
							(const glw::GLvoid*)(deUintptr)m_po_bo1_double_attr_offset);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribLPointer() call failed.");

	gl.enableVertexAttribArray(m_po_bo1_double_attr_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray() call failed.");

	gl.vertexAttribPointer(m_po_bo1_float2_attr_location, 1, /* size */
						   GL_SHORT, GL_FALSE,				 /* normalized */
						   m_po_bo1_float2_attr_stride, (const glw::GLvoid*)(deUintptr)m_po_bo1_float2_attr_offset);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer() call failed.");

	gl.enableVertexAttribArray(m_po_bo1_float2_attr_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray() call failed.");

	gl.vertexAttribIPointer(m_po_bo1_int_attr_location, 1, /* size */
							GL_BYTE, m_po_bo1_int_attr_stride, (const glw::GLvoid*)(deUintptr)m_po_bo1_int_attr_offset);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribIPointer() call failed.");

	gl.enableVertexAttribArray(m_po_bo1_int_attr_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray() call failed.");

	/* Set up BO2-sourced attributes */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id_2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.vertexAttribPointer(m_po_bo2_float_attr_location, 1, /* size */
						   GL_UNSIGNED_BYTE, GL_TRUE, m_po_bo2_float_attr_stride,
						   (const glw::GLvoid*)(deUintptr)m_po_bo2_float_attr_offset);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer() call failed.");

	gl.enableVertexAttribArray(m_po_bo2_float_attr_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray() call failed.");

	gl.vertexAttribLPointer(m_po_bo2_dmat4x2_attr_location + 0, 2, /* size */
							GL_DOUBLE, m_po_bo2_dmat4x2_attr_stride,
							(const glw::GLvoid*)(deUintptr)m_po_bo2_dmat4x2_attr_offset);
	gl.vertexAttribLPointer(m_po_bo2_dmat4x2_attr_location + 1, 2, /* size */
							GL_DOUBLE, m_po_bo2_dmat4x2_attr_stride,
							(const glw::GLvoid*)(m_po_bo2_dmat4x2_attr_offset + 2 * sizeof(double)));
	gl.vertexAttribLPointer(m_po_bo2_dmat4x2_attr_location + 2, 2, /* size */
							GL_DOUBLE, m_po_bo2_dmat4x2_attr_stride,
							(const glw::GLvoid*)(m_po_bo2_dmat4x2_attr_offset + 4 * sizeof(double)));
	gl.vertexAttribLPointer(m_po_bo2_dmat4x2_attr_location + 3, 2, /* size */
							GL_DOUBLE, m_po_bo2_dmat4x2_attr_stride,
							(const glw::GLvoid*)(m_po_bo2_dmat4x2_attr_offset + 6 * sizeof(double)));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribLPointer() call failed.");

	gl.enableVertexAttribArray(m_po_bo2_dmat4x2_attr_location + 0);
	gl.enableVertexAttribArray(m_po_bo2_dmat4x2_attr_location + 1);
	gl.enableVertexAttribArray(m_po_bo2_dmat4x2_attr_location + 2);
	gl.enableVertexAttribArray(m_po_bo2_dmat4x2_attr_location + 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray() call(s) failed.");

	/* Set up element binding */
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_bo_id_indices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");
}